

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

void Util::inner::join_helper<char_const*,std::__cxx11::string_const&>
               (ostringstream *stream,char **t,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts)

{
  char *__s;
  size_t sVar1;
  
  __s = *t;
  if (__s == (char *)0x0) {
    std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)stream,(ts->_M_dataplus)._M_p,ts->_M_string_length);
  return;
}

Assistant:

void join_helper(std::ostringstream &stream, T &&t, Ts &&... ts)
{
	stream << std::forward<T>(t);
	join_helper(stream, std::forward<Ts>(ts)...);
}